

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O3

NewConverter * CnvExtOpen(UCMFile *ucm)

{
  NewConverter *pNVar1;
  
  pNVar1 = (NewConverter *)uprv_malloc_63(0xe0080);
  if (pNVar1 != (NewConverter *)0x0) {
    memset(&pNVar1[1].isValid,0,0xe0058);
    pNVar1[1].close = (_func_void_NewConverter_ptr *)ucm;
    pNVar1->close = CnvExtClose;
    pNVar1->isValid = CnvExtIsValid;
    pNVar1->addTable = CnvExtAddTable;
    pNVar1->write = CnvExtWrite;
    return pNVar1;
  }
  puts("out of memory");
  exit(7);
}

Assistant:

NewConverter *
CnvExtOpen(UCMFile *ucm) {
    CnvExtData *extData;
    
    extData=(CnvExtData *)uprv_malloc(sizeof(CnvExtData));
    if(extData==NULL) {
        printf("out of memory\n");
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    uprv_memset(extData, 0, sizeof(CnvExtData));

    extData->ucm=ucm; /* aliased, not owned */

    extData->newConverter.close=CnvExtClose;
    extData->newConverter.isValid=CnvExtIsValid;
    extData->newConverter.addTable=CnvExtAddTable;
    extData->newConverter.write=CnvExtWrite;
    return &extData->newConverter;
}